

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O0

Matrix2f operator*(float f,Matrix2f *m)

{
  float fVar1;
  float *pfVar2;
  Matrix2f *in_RSI;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  undefined8 in_XMM1_Qa;
  Matrix2f MVar4;
  undefined4 local_28;
  undefined4 local_24;
  int j;
  int i;
  Matrix2f *m_local;
  float f_local;
  Matrix2f *output;
  
  Matrix2f::Matrix2f(m,0.0);
  uVar3 = extraout_XMM0_Qa;
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      pfVar2 = Matrix2f::operator()(in_RSI,local_24,local_28);
      fVar1 = *pfVar2;
      pfVar2 = Matrix2f::operator()(m,local_24,local_28);
      uVar3 = (ulong)(uint)(f * fVar1);
      *pfVar2 = f * fVar1;
    }
  }
  MVar4.m_elements[2] = (float)(int)in_XMM1_Qa;
  MVar4.m_elements[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  MVar4.m_elements[0] = (float)(int)uVar3;
  MVar4.m_elements[1] = (float)(int)(uVar3 >> 0x20);
  return (Matrix2f)MVar4.m_elements;
}

Assistant:

Matrix2f operator * ( float f, const Matrix2f& m )
{
	Matrix2f output;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			output( i, j ) = f * m( i, j );
		}
	}

	return output;
}